

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

ON_XMLNode * __thiscall
ON_XMLNodePrivate::AttachChildNode(ON_XMLNodePrivate *this,ON_XMLNode *pNode)

{
  lock_guard<std::recursive_mutex> local_28;
  lock_guard<std::recursive_mutex> lg;
  ON_XMLNode *pNode_local;
  ON_XMLNodePrivate *this_local;
  
  if (pNode == (ON_XMLNode *)0x0) {
    this_local = (ON_XMLNodePrivate *)0x0;
  }
  else {
    lg._M_device = (mutex_type *)pNode;
    std::lock_guard<std::recursive_mutex>::lock_guard(&local_28,&this->m_mutex);
    if (this->m_last_child == (ON_XMLNode *)0x0) {
      this->m_first_child = (ON_XMLNode *)lg._M_device;
      this->m_last_child = (ON_XMLNode *)lg._M_device;
    }
    else {
      this->m_last_child->_private->m_next_sibling = (ON_XMLNode *)lg._M_device;
      this->m_last_child = (ON_XMLNode *)lg._M_device;
    }
    *(undefined8 *)
     (*(long *)((long)&((lg._M_device)->super___recursive_mutex_base)._M_mutex + 8) + 0x10) = 0;
    *(ON_XMLNode **)
     (*(long *)((long)&((lg._M_device)->super___recursive_mutex_base)._M_mutex + 8) + 0x18) =
         this->m_node;
    this_local = (ON_XMLNodePrivate *)lg._M_device;
    std::lock_guard<std::recursive_mutex>::~lock_guard(&local_28);
  }
  return (ON_XMLNode *)this_local;
}

Assistant:

ON_XMLNode* ON_XMLNodePrivate::AttachChildNode(ON_XMLNode* pNode)
{
  if (nullptr == pNode)
    return nullptr;

  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  if (nullptr == m_last_child)
  {
    // There are no children - add one.
    m_last_child = m_first_child = pNode;
  }
  else
  {
    // There are children - add one to the end.
    m_last_child->_private->m_next_sibling = pNode;
    m_last_child = pNode;
  }

  pNode->_private->m_next_sibling = nullptr;
  pNode->_private->m_parent = &m_node;

  return pNode;
}